

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesImageSparseBinding.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::sparse::anon_unknown_4::ImageSparseBindingInstance::iterate
          (TestStatus *__return_storage_ptr__,ImageSparseBindingInstance *this)

{
  VkCommandBuffer_s *pVVar1;
  deUint64 dVar2;
  VkImage image;
  VkQueue pVVar3;
  VkCommandBuffer commandBuffer_00;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data_00;
  VkImageSubresourceRange subresourceRange;
  Deleter<vk::Handle<(vk::HandleType)7>_> deleter;
  RefData<vk::Handle<(vk::HandleType)9>_> data_01;
  RefData<vk::Handle<(vk::HandleType)4>_> data_02;
  RefData<vk::Handle<(vk::HandleType)24>_> data_03;
  RefData<vk::VkCommandBuffer_s_*> data_04;
  RefData<vk::Handle<(vk::HandleType)8>_> data_05;
  RefData<vk::Handle<(vk::HandleType)8>_> data_06;
  VkImageSubresourceRange subresourceRange_00;
  uint bindCount;
  undefined1 auVar4 [8];
  bool bVar5;
  VkResult result;
  deUint32 dVar6;
  int iVar7;
  InstanceInterface *instance_00;
  NotSupportedError *pNVar8;
  VkDevice pVVar9;
  Handle<(vk::HandleType)9> *pHVar10;
  Checked<vk::Handle<(vk::HandleType)7>_> object;
  reference pBinds;
  Handle<(vk::HandleType)24> *pHVar11;
  ulong uVar12;
  reference pvVar13;
  VkCommandBuffer_s **ppVVar14;
  Allocator *pAVar15;
  Handle<(vk::HandleType)8> *pHVar16;
  reference pvVar17;
  Allocation *pAVar18;
  void *pvVar19;
  VkDeviceSize VVar20;
  size_type sVar21;
  Handle<(vk::HandleType)4> *pWaitSemaphores;
  Queue *pQVar22;
  VkExtent3D VVar23;
  VkExtent3D extent;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  deUint32 local_e74;
  deUint32 local_e6c;
  allocator<char> local_ca1;
  string local_ca0;
  allocator<char> local_c79;
  string local_c78;
  uint local_c54;
  deUint32 local_c50;
  deUint32 bufferOffset_1;
  deUint32 mipLevelSizeInBytes;
  deUint32 mipmapNdx_1;
  deUint8 *outputData;
  VkPipelineStageFlags local_c34;
  VkBuffer VStack_c30;
  VkPipelineStageFlags stageBits [1];
  undefined1 local_c28 [8];
  VkBufferMemoryBarrier outputBufferBarrier;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_bd0;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_bc0;
  undefined1 local_bb0 [8];
  UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> outputBufferAlloc;
  RefData<vk::Handle<(vk::HandleType)8>_> local_b80;
  undefined1 local_b60 [8];
  Unique<vk::Handle<(vk::HandleType)8>_> outputBuffer;
  VkBufferCreateInfo outputBufferCreateInfo;
  undefined8 uStack_b00;
  deUint32 local_af8;
  undefined1 local_ae8 [8];
  VkImageMemoryBarrier imageSparseTransferSrcBarrier;
  VkImageSubresourceRange local_a90;
  VkImage local_a78;
  undefined1 local_a70 [8];
  VkImageMemoryBarrier imageSparseTransferDstBarrier;
  undefined1 local_a20 [8];
  VkBufferMemoryBarrier inputBufferBarrier;
  uint local_9e0;
  allocator<unsigned_char> local_9d9;
  deUint32 valueNdx;
  vector<unsigned_char,_std::allocator<unsigned_char>_> referenceData;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_9b0;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_9a0;
  undefined1 local_990 [8];
  UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> inputBufferAlloc;
  RefData<vk::Handle<(vk::HandleType)8>_> local_960;
  undefined1 local_940 [8];
  Unique<vk::Handle<(vk::HandleType)8>_> inputBuffer;
  VkBufferCreateInfo inputBufferCreateInfo;
  deUint32 imageSizeInBytes;
  VkBufferImageCopy local_8b0;
  deUint32 local_874;
  deUint32 local_870;
  deUint32 mipmapNdx;
  deUint32 bufferOffset;
  vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_> bufferImageCopy;
  Move<vk::VkCommandBuffer_s_*> local_848;
  RefData<vk::VkCommandBuffer_s_*> local_828;
  undefined1 local_808 [8];
  Unique<vk::VkCommandBuffer_s_*> commandBuffer;
  RefData<vk::Handle<(vk::HandleType)24>_> local_7c8;
  undefined1 local_7a8 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> commandPool;
  undefined4 local_780 [2];
  VkBindSparseInfo bindSparseInfo;
  undefined1 local_718 [8];
  VkSparseImageOpaqueMemoryBindInfo opaqueBindInfo;
  undefined8 uStack_6f8;
  undefined8 local_6f0;
  Move<vk::Handle<(vk::HandleType)7>_> local_6d8;
  value_type local_6b8;
  undefined1 local_6a8 [8];
  VkSparseMemoryBind sparseMemoryBind;
  deUint32 sparseBindNdx;
  string local_670;
  deUint32 local_650;
  uint local_64c;
  deUint32 memoryType;
  deUint32 numSparseBinds;
  vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_> sparseMemoryBinds;
  ulong local_4d0;
  undefined1 local_2f0 [8];
  VkMemoryRequirements imageSparseMemRequirements;
  RefData<vk::Handle<(vk::HandleType)4>_> local_2b8;
  undefined1 local_298 [8];
  Unique<vk::Handle<(vk::HandleType)4>_> imageMemoryBindSemaphore;
  RefData<vk::Handle<(vk::HandleType)9>_> local_258;
  undefined1 local_238 [8];
  Unique<vk::Handle<(vk::HandleType)9>_> imageSparse;
  VkImageFormatProperties imageFormatProperties;
  UVec3 local_1e4;
  VkExtent3D local_1d8;
  Queue *local_1c8;
  Queue *computeQueue;
  Queue *sparseQueue;
  DeviceInterface *deviceInterface;
  QueueRequirements local_1a8;
  undefined1 local_1a0 [8];
  QueueRequirementsVec queueRequirements;
  int local_d8;
  undefined1 local_a0 [8];
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
  deviceMemUniquePtrVec;
  VkImageCreateInfo imageSparseInfo;
  VkPhysicalDevice physicalDevice;
  InstanceInterface *instance;
  ImageSparseBindingInstance *this_local;
  
  instance_00 = Context::getInstanceInterface
                          ((this->super_SparseResourcesBaseInstance).super_TestInstance.m_context);
  imageSparseInfo._80_8_ =
       Context::getPhysicalDevice
                 ((this->super_SparseResourcesBaseInstance).super_TestInstance.m_context);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
  ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
            *)local_a0);
  bVar5 = isImageSizeSupported
                    (instance_00,(VkPhysicalDevice)imageSparseInfo._80_8_,this->m_imageType,
                     &this->m_imageSize);
  if (!bVar5) {
    pNVar8 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar8,"Image size not supported for device",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesImageSparseBinding.cpp"
               ,0x7a);
    __cxa_throw(pNVar8,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  ::vk::getPhysicalDeviceFeatures
            ((VkPhysicalDeviceFeatures *)
             &queueRequirements.
              super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,instance_00,
             (VkPhysicalDevice)imageSparseInfo._80_8_);
  if (local_d8 == 0) {
    pNVar8 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar8,"Device does not support sparse binding",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesImageSparseBinding.cpp"
               ,0x7e);
    __cxa_throw(pNVar8,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  std::vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>::
  vector((vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_> *)
         local_1a0);
  QueueRequirements::QueueRequirements(&local_1a8,8,1);
  std::vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>::
  push_back((vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
             *)local_1a0,&local_1a8);
  QueueRequirements::QueueRequirements((QueueRequirements *)&deviceInterface,2,1);
  std::vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>::
  push_back((vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
             *)local_1a0,(value_type *)&deviceInterface);
  SparseResourcesBaseInstance::createDeviceSupportingQueues
            (&this->super_SparseResourcesBaseInstance,(QueueRequirementsVec *)local_1a0);
  std::vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>::
  ~vector((vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_> *
          )local_1a0);
  sparseQueue = (Queue *)SparseResourcesBaseInstance::getDeviceInterface
                                   (&this->super_SparseResourcesBaseInstance);
  computeQueue = SparseResourcesBaseInstance::getQueue(&this->super_SparseResourcesBaseInstance,8,0)
  ;
  local_1c8 = SparseResourcesBaseInstance::getQueue(&this->super_SparseResourcesBaseInstance,2,0);
  deviceMemUniquePtrVec.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0xe;
  imageSparseInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageSparseInfo._4_4_ = 0;
  imageSparseInfo.pNext._0_4_ = 1;
  imageSparseInfo.pNext._4_4_ = mapImageType(this->m_imageType);
  imageSparseInfo.flags = ::vk::mapTextureFormat(&this->m_format);
  getLayerSize((sparse *)&local_1e4,this->m_imageType,&this->m_imageSize);
  local_1d8 = ::vk::makeExtent3D(&local_1e4);
  imageSparseInfo._20_12_ = local_1d8;
  imageSparseInfo.extent.depth = getNumLayers(this->m_imageType,&this->m_imageSize);
  imageSparseInfo.mipLevels = 1;
  imageSparseInfo.arrayLayers = 0;
  imageSparseInfo.pQueueFamilyIndices._0_4_ = 0;
  imageSparseInfo.samples = VK_SAMPLE_COUNT_2_BIT|VK_SAMPLE_COUNT_1_BIT;
  imageSparseInfo.tiling = VK_IMAGE_TILING_OPTIMAL;
  imageSparseInfo.usage = 0;
  imageSparseInfo.queueFamilyIndexCount = 0;
  imageSparseInfo._68_4_ = 0;
  if ((this->m_imageType == IMAGE_TYPE_CUBE) || (this->m_imageType == IMAGE_TYPE_CUBE_ARRAY)) {
    imageSparseInfo.pNext._0_4_ = (uint)imageSparseInfo.pNext | 0x10;
  }
  (*instance_00->_vptr_InstanceInterface[4])
            (instance_00,imageSparseInfo._80_8_,(ulong)imageSparseInfo.flags,
             (ulong)imageSparseInfo.pNext._4_4_,0,3,(uint)imageSparseInfo.pNext,
             (int)&imageSparse.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
                   m_allocator);
  imageSparseInfo.extent.height =
       getImageMaxMipLevels
                 ((VkImageFormatProperties *)
                  &imageSparse.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
                   m_allocator,(VkExtent3D *)&imageSparseInfo.imageType);
  pQVar22 = sparseQueue;
  pVVar9 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
  ::vk::createImage((Move<vk::Handle<(vk::HandleType)9>_> *)
                    &imageMemoryBindSemaphore.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.
                     deleter.m_allocator,(DeviceInterface *)pQVar22,pVVar9,
                    (VkImageCreateInfo *)
                    &deviceMemUniquePtrVec.
                     super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,(VkAllocationCallbacks *)0x0
                   );
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_258,
             (Move *)&imageMemoryBindSemaphore.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.
                      deleter.m_allocator);
  data_01.deleter.m_deviceIface._0_4_ = (int)local_258.deleter.m_deviceIface;
  data_01.object.m_internal = local_258.object.m_internal;
  data_01.deleter.m_deviceIface._4_4_ = (int)((ulong)local_258.deleter.m_deviceIface >> 0x20);
  data_01.deleter.m_device._0_4_ = (int)local_258.deleter.m_device;
  data_01.deleter.m_device._4_4_ = (int)((ulong)local_258.deleter.m_device >> 0x20);
  data_01.deleter.m_allocator._0_4_ = (int)local_258.deleter.m_allocator;
  data_01.deleter.m_allocator._4_4_ = (int)((ulong)local_258.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)9>_> *)local_238,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)9>_> *)
             &imageMemoryBindSemaphore.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.
              m_allocator);
  pQVar22 = sparseQueue;
  pVVar9 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
  ::vk::createSemaphore
            ((Move<vk::Handle<(vk::HandleType)4>_> *)&imageSparseMemRequirements.memoryTypeBits,
             (DeviceInterface *)pQVar22,pVVar9,0,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_2b8,(Move *)&imageSparseMemRequirements.memoryTypeBits);
  data_02.deleter.m_deviceIface._0_4_ = (int)local_2b8.deleter.m_deviceIface;
  data_02.object.m_internal = local_2b8.object.m_internal;
  data_02.deleter.m_deviceIface._4_4_ = (int)((ulong)local_2b8.deleter.m_deviceIface >> 0x20);
  data_02.deleter.m_device._0_4_ = (int)local_2b8.deleter.m_device;
  data_02.deleter.m_device._4_4_ = (int)((ulong)local_2b8.deleter.m_device >> 0x20);
  data_02.deleter.m_allocator._0_4_ = (int)local_2b8.deleter.m_allocator;
  data_02.deleter.m_allocator._4_4_ = (int)((ulong)local_2b8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)4>_> *)local_298,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)4>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)4>_> *)&imageSparseMemRequirements.memoryTypeBits);
  pQVar22 = sparseQueue;
  pVVar9 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
  pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)9>_> *)local_238);
  ::vk::getImageMemoryRequirements
            ((VkMemoryRequirements *)local_2f0,(DeviceInterface *)pQVar22,pVVar9,
             (VkImage)pHVar10->m_internal);
  auVar4 = local_2f0;
  ::vk::getPhysicalDeviceProperties
            ((VkPhysicalDeviceProperties *)
             &sparseMemoryBinds.
              super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,instance_00,
             (VkPhysicalDevice)imageSparseInfo._80_8_);
  if (local_4d0 < (ulong)auVar4) {
    pNVar8 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar8,"Required memory size for sparse resource exceeds device limits",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesImageSparseBinding.cpp"
               ,0xba);
    __cxa_throw(pNVar8,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  std::vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>::vector
            ((vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_> *)&memoryType)
  ;
  local_64c = (uint)((ulong)local_2f0 / imageSparseMemRequirements.size);
  local_650 = findMatchingMemoryType
                        (instance_00,(VkPhysicalDevice)imageSparseInfo._80_8_,
                         (VkMemoryRequirements *)local_2f0,
                         (MemoryRequirement *)&::vk::MemoryRequirement::Any);
  if (local_650 == 0xffffffff) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_670,"No matching memory type found",
               (allocator<char> *)((long)&sparseBindNdx + 3));
    tcu::TestStatus::fail(__return_storage_ptr__,&local_670);
    std::__cxx11::string::~string((string *)&local_670);
    std::allocator<char>::~allocator((allocator<char> *)((long)&sparseBindNdx + 3));
    bVar5 = true;
  }
  else {
    for (sparseMemoryBind._36_4_ = 0; pQVar22 = sparseQueue,
        (uint)sparseMemoryBind._36_4_ < local_64c;
        sparseMemoryBind._36_4_ = sparseMemoryBind._36_4_ + 1) {
      pVVar9 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
      makeSparseMemoryBind
                ((VkSparseMemoryBind *)local_6a8,(DeviceInterface *)pQVar22,pVVar9,
                 imageSparseMemRequirements.size,local_650,
                 imageSparseMemRequirements.size * (uint)sparseMemoryBind._36_4_);
      object = ::vk::refdetails::check<vk::Handle<(vk::HandleType)7>>
                         ((Handle<(vk::HandleType)7>)sparseMemoryBind.size);
      pQVar22 = sparseQueue;
      pVVar9 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)7>_>::Deleter
                ((Deleter<vk::Handle<(vk::HandleType)7>_> *)&opaqueBindInfo.pBinds,
                 (DeviceInterface *)pQVar22,pVVar9,(VkAllocationCallbacks *)0x0);
      deleter.m_device._0_4_ = (int)uStack_6f8;
      deleter.m_deviceIface = (DeviceInterface *)opaqueBindInfo.pBinds;
      deleter.m_device._4_4_ = (int)((ulong)uStack_6f8 >> 0x20);
      deleter.m_allocator._0_4_ = (int)local_6f0;
      deleter.m_allocator._4_4_ = (int)((ulong)local_6f0 >> 0x20);
      ::vk::refdetails::Move<vk::Handle<(vk::HandleType)7>>::Move<vk::Handle<(vk::HandleType)7>>
                ((Move<vk::Handle<(vk::HandleType)7>> *)&local_6d8,object,deleter);
      makeVkSharedPtr<vk::Handle<(vk::HandleType)7>>((sparse *)&local_6b8,&local_6d8);
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
      ::push_back((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
                   *)local_a0,&local_6b8);
      de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>::~SharedPtr(&local_6b8)
      ;
      ::vk::refdetails::Move<vk::Handle<(vk::HandleType)7>_>::~Move(&local_6d8);
      std::vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>::push_back
                ((vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_> *)
                 &memoryType,(value_type *)local_6a8);
    }
    pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)9>_> *)local_238);
    bindCount = local_64c;
    bindSparseInfo.pSignalSemaphores = (VkSemaphore *)pHVar10->m_internal;
    pBinds = std::vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>::
             operator[]((vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_> *)
                        &memoryType,0);
    ::vk::makeSparseImageOpaqueMemoryBindInfo
              ((VkSparseImageOpaqueMemoryBindInfo *)local_718,
               (VkImage)bindSparseInfo.pSignalSemaphores,bindCount,pBinds);
    local_780[0] = 7;
    bindSparseInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    bindSparseInfo._4_4_ = 0;
    bindSparseInfo.pNext._0_4_ = 0;
    bindSparseInfo.waitSemaphoreCount = 0;
    bindSparseInfo._20_4_ = 0;
    bindSparseInfo.pWaitSemaphores._0_4_ = 0;
    bindSparseInfo.bufferBindCount = 0;
    bindSparseInfo._36_4_ = 0;
    bindSparseInfo.pBufferBinds._0_4_ = 1;
    bindSparseInfo._48_8_ = local_718;
    bindSparseInfo.pImageOpaqueBinds._0_4_ = 0;
    bindSparseInfo.imageBindCount = 0;
    bindSparseInfo._68_4_ = 0;
    bindSparseInfo.pImageBinds._0_4_ = 1;
    bindSparseInfo._80_8_ =
         ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)4>_>::get
                   ((RefBase<vk::Handle<(vk::HandleType)4>_> *)local_298);
    pQVar22 = sparseQueue;
    pVVar3 = computeQueue->queueHandle;
    ::vk::Handle<(vk::HandleType)6>::Handle
              ((Handle<(vk::HandleType)6> *)
               &commandPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                m_allocator,0);
    result = (**(code **)(pQVar22->queueHandle + 0x88))(pQVar22,pVVar3,1,local_780);
    ::vk::checkResult(result,
                      "deviceInterface.queueBindSparse(sparseQueue.queueHandle, 1u, &bindSparseInfo, DE_NULL)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesImageSparseBinding.cpp"
                      ,0xe3);
    bVar5 = false;
  }
  std::vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>::~vector
            ((vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_> *)&memoryType)
  ;
  pQVar22 = sparseQueue;
  if (!bVar5) {
    pVVar9 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
    makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)
                    &commandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,
                    (DeviceInterface *)pQVar22,pVVar9,local_1c8->queueFamilyIndex);
    ::vk::refdetails::Move::operator_cast_to_RefData
              (&local_7c8,
               (Move *)&commandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
    data_03.deleter.m_deviceIface._0_4_ = (int)local_7c8.deleter.m_deviceIface;
    data_03.object.m_internal = local_7c8.object.m_internal;
    data_03.deleter.m_deviceIface._4_4_ = (int)((ulong)local_7c8.deleter.m_deviceIface >> 0x20);
    data_03.deleter.m_device._0_4_ = (int)local_7c8.deleter.m_device;
    data_03.deleter.m_device._4_4_ = (int)((ulong)local_7c8.deleter.m_device >> 0x20);
    data_03.deleter.m_allocator._0_4_ = (int)local_7c8.deleter.m_allocator;
    data_03.deleter.m_allocator._4_4_ = (int)((ulong)local_7c8.deleter.m_allocator >> 0x20);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
              ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_7a8,data_03);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
              ((Move<vk::Handle<(vk::HandleType)24>_> *)
               &commandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
    pQVar22 = sparseQueue;
    pVVar9 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
    pHVar11 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_7a8);
    bufferImageCopy.
    super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)pHVar11->m_internal;
    ::vk::allocateCommandBuffer
              (&local_848,(DeviceInterface *)pQVar22,pVVar9,
               (VkCommandPool)
               bufferImageCopy.
               super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_828,(Move *)&local_848);
    uVar24 = SUB84(local_828.object,0);
    uVar25 = (undefined4)((ulong)local_828.object >> 0x20);
    data_04.deleter.m_deviceIface._0_4_ = (int)local_828.deleter.m_deviceIface;
    data_04.object = local_828.object;
    data_04.deleter.m_deviceIface._4_4_ = (int)((ulong)local_828.deleter.m_deviceIface >> 0x20);
    data_04.deleter.m_device._0_4_ = (int)local_828.deleter.m_device;
    data_04.deleter.m_device._4_4_ = (int)((ulong)local_828.deleter.m_device >> 0x20);
    data_04.deleter.m_pool.m_internal._0_4_ = (int)local_828.deleter.m_pool.m_internal;
    data_04.deleter.m_pool.m_internal._4_4_ = (int)(local_828.deleter.m_pool.m_internal >> 0x20);
    ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
              ((Unique<vk::VkCommandBuffer_s_*> *)local_808,data_04);
    ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_848);
    uVar12 = (ulong)imageSparseInfo.extent.height;
    std::allocator<vk::VkBufferImageCopy>::allocator
              ((allocator<vk::VkBufferImageCopy> *)((long)&mipmapNdx + 3));
    std::vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>::vector
              ((vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_> *)
               &bufferOffset,uVar12,(allocator<vk::VkBufferImageCopy> *)((long)&mipmapNdx + 3));
    std::allocator<vk::VkBufferImageCopy>::~allocator
              ((allocator<vk::VkBufferImageCopy> *)((long)&mipmapNdx + 3));
    local_870 = 0;
    for (local_874 = 0; pQVar22 = sparseQueue, local_874 < imageSparseInfo.extent.height;
        local_874 = local_874 + 1) {
      VVar23 = mipLevelExtents((VkExtent3D *)&imageSparseInfo.imageType,local_874);
      extent.width = VVar23.depth;
      extent.height = 0;
      extent.depth = imageSparseInfo.extent.depth;
      makeBufferImageCopy(&local_8b0,VVar23._0_8_,extent,local_874,local_870,CONCAT44(uVar25,uVar24)
                         );
      pvVar13 = std::vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>::
                operator[]((vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_> *)
                           &bufferOffset,(ulong)local_874);
      (pvVar13->imageExtent).height = local_8b0.imageExtent.height;
      (pvVar13->imageExtent).depth = local_8b0.imageExtent.depth;
      (pvVar13->imageOffset).x = local_8b0.imageOffset.x;
      (pvVar13->imageOffset).y = local_8b0.imageOffset.y;
      *(undefined8 *)&(pvVar13->imageOffset).z = local_8b0._40_8_;
      (pvVar13->imageSubresource).aspectMask = local_8b0.imageSubresource.aspectMask;
      (pvVar13->imageSubresource).mipLevel = local_8b0.imageSubresource.mipLevel;
      (pvVar13->imageSubresource).baseArrayLayer = local_8b0.imageSubresource.baseArrayLayer;
      (pvVar13->imageSubresource).layerCount = local_8b0.imageSubresource.layerCount;
      pvVar13->bufferOffset = local_8b0.bufferOffset;
      pvVar13->bufferRowLength = local_8b0.bufferRowLength;
      pvVar13->bufferImageHeight = local_8b0.bufferImageHeight;
      dVar6 = getImageMipLevelSizeInBytes
                        ((VkExtent3D *)&imageSparseInfo.imageType,imageSparseInfo.extent.depth,
                         &this->m_format,local_874,4);
      local_870 = dVar6 + local_870;
    }
    ppVVar14 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_808);
    beginCommandBuffer((DeviceInterface *)pQVar22,*ppVVar14);
    dVar6 = getImageSizeInBytes((VkExtent3D *)&imageSparseInfo.imageType,
                                imageSparseInfo.extent.depth,&this->m_format,
                                imageSparseInfo.extent.height,4);
    makeBufferCreateInfo
              ((VkBufferCreateInfo *)
               &inputBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator
               ,(ulong)dVar6,1);
    pQVar22 = sparseQueue;
    pVVar9 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
    ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)
                       &inputBufferAlloc.
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
                        .field_0x8,(DeviceInterface *)pQVar22,pVVar9,
                       (VkBufferCreateInfo *)
                       &inputBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                        m_allocator,(VkAllocationCallbacks *)0x0);
    ::vk::refdetails::Move::operator_cast_to_RefData
              (&local_960,
               (Move *)&inputBufferAlloc.
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
                        .field_0x8);
    uVar24 = (undefined4)local_960.object.m_internal;
    uVar25 = (undefined4)(local_960.object.m_internal >> 0x20);
    uVar26 = SUB84(local_960.deleter.m_deviceIface,0);
    uVar27 = (undefined4)((ulong)local_960.deleter.m_deviceIface >> 0x20);
    data_05.deleter.m_deviceIface._0_4_ = uVar26;
    data_05.object.m_internal = local_960.object.m_internal;
    data_05.deleter.m_deviceIface._4_4_ = uVar27;
    data_05.deleter.m_device._0_4_ = (int)local_960.deleter.m_device;
    data_05.deleter.m_device._4_4_ = (int)((ulong)local_960.deleter.m_device >> 0x20);
    data_05.deleter.m_allocator._0_4_ = (int)local_960.deleter.m_allocator;
    data_05.deleter.m_allocator._4_4_ = (int)((ulong)local_960.deleter.m_allocator >> 0x20);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::Unique
              ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_940,data_05);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move
              ((Move<vk::Handle<(vk::HandleType)8>_> *)
               &inputBufferAlloc.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                field_0x8);
    pQVar22 = sparseQueue;
    pVVar9 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
    pAVar15 = SparseResourcesBaseInstance::getAllocator(&this->super_SparseResourcesBaseInstance);
    pHVar16 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_940);
    referenceData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = ::vk::MemoryRequirement::HostVisible.m_flags;
    bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_9b0,
               (DeviceInterface *)pQVar22,pVVar9,pAVar15,(VkBuffer)pHVar16->m_internal,
               ::vk::MemoryRequirement::HostVisible);
    local_9a0 = de::details::MovePtr::operator_cast_to_PtrData(&local_9b0,(MovePtr *)pQVar22);
    data.ptr._4_4_ = uVar25;
    data.ptr._0_4_ = uVar24;
    data._8_4_ = uVar26;
    data._12_4_ = uVar27;
    de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::UniquePtr
              ((UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_990,data);
    de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
              ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_9b0);
    std::allocator<unsigned_char>::allocator(&local_9d9);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&valueNdx,(ulong)dVar6,
               &local_9d9);
    std::allocator<unsigned_char>::~allocator(&local_9d9);
    for (local_9e0 = 0; local_9e0 < dVar6; local_9e0 = local_9e0 + 1) {
      uVar12 = (ulong)local_9e0 % imageSparseMemRequirements.size;
      pvVar17 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&valueNdx,
                           (ulong)local_9e0);
      *pvVar17 = (char)uVar12 + '\x01';
    }
    pAVar18 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
              operator->((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                         local_990);
    pvVar19 = ::vk::Allocation::getHostPtr(pAVar18);
    pvVar17 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&valueNdx,0);
    ::deMemcpy(pvVar19,pvVar17,(ulong)dVar6);
    pQVar22 = sparseQueue;
    pVVar9 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
    pAVar18 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
              operator->((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                         local_990);
    inputBufferBarrier.size = (VkDeviceSize)::vk::Allocation::getMemory(pAVar18);
    pAVar18 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
              operator->((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                         local_990);
    VVar20 = ::vk::Allocation::getOffset(pAVar18);
    ::vk::flushMappedMemoryRange
              ((DeviceInterface *)pQVar22,pVVar9,(VkDeviceMemory)inputBufferBarrier.size,VVar20,
               (ulong)dVar6);
    pHVar16 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_940);
    imageSparseTransferDstBarrier._64_8_ = pHVar16->m_internal;
    makeBufferMemoryBarrier
              ((VkBufferMemoryBarrier *)local_a20,0x4000,0x800,
               (VkBuffer)imageSparseTransferDstBarrier._64_8_,0,(ulong)dVar6);
    pQVar22 = sparseQueue;
    ppVVar14 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_808);
    (**(code **)(pQVar22->queueHandle + 0x368))
              (pQVar22,*ppVVar14,0x4000,0x1000,0,0,0,1,(int)local_a20,0,0);
    if (computeQueue->queueFamilyIndex == local_1c8->queueFamilyIndex) {
      local_e6c = 0xffffffff;
    }
    else {
      local_e6c = computeQueue->queueFamilyIndex;
    }
    if (computeQueue->queueFamilyIndex == local_1c8->queueFamilyIndex) {
      local_e74 = 0xffffffff;
    }
    else {
      local_e74 = local_1c8->queueFamilyIndex;
    }
    pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)9>_> *)local_238);
    local_a78.m_internal = pHVar10->m_internal;
    ::vk::makeImageSubresourceRange
              (&local_a90,1,0,imageSparseInfo.extent.height,0,imageSparseInfo.extent.depth);
    subresourceRange_00.levelCount = local_a90.levelCount;
    subresourceRange_00.aspectMask = local_a90.aspectMask;
    subresourceRange_00.baseMipLevel = local_a90.baseMipLevel;
    subresourceRange_00.baseArrayLayer = local_a90.baseArrayLayer;
    subresourceRange_00.layerCount = local_a90.layerCount;
    makeImageMemoryBarrier
              ((VkImageMemoryBarrier *)local_a70,0,0x1000,VK_IMAGE_LAYOUT_UNDEFINED,
               VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,local_e6c,local_e74,local_a78,
               subresourceRange_00);
    pQVar22 = sparseQueue;
    ppVVar14 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_808);
    (**(code **)(pQVar22->queueHandle + 0x368))
              (pQVar22,*ppVVar14,1,0x1000,0,0,0,0,0,1,(int)local_a70);
    pQVar22 = sparseQueue;
    ppVVar14 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_808);
    pVVar1 = *ppVVar14;
    pHVar16 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_940);
    dVar2 = pHVar16->m_internal;
    pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)9>_> *)local_238);
    imageSparseTransferSrcBarrier._64_8_ = pHVar10->m_internal;
    sVar21 = std::vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>::size
                       ((vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_> *)
                        &bufferOffset);
    pvVar13 = std::vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>::operator[]
                        ((vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_> *)
                         &bufferOffset,0);
    (**(code **)(pQVar22->queueHandle + 0x310))
              (pQVar22,pVVar1,dVar2,imageSparseTransferSrcBarrier._64_8_,7,sVar21 & 0xffffffff,
               (int)pvVar13);
    pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)9>_> *)local_238);
    image.m_internal = pHVar10->m_internal;
    ::vk::makeImageSubresourceRange
              ((VkImageSubresourceRange *)&outputBufferCreateInfo.pQueueFamilyIndices,1,0,
               imageSparseInfo.extent.height,0,imageSparseInfo.extent.depth);
    subresourceRange.levelCount = (int)uStack_b00;
    subresourceRange._0_8_ = outputBufferCreateInfo.pQueueFamilyIndices;
    subresourceRange.baseArrayLayer = (int)((ulong)uStack_b00 >> 0x20);
    subresourceRange.layerCount = local_af8;
    makeImageMemoryBarrier
              ((VkImageMemoryBarrier *)local_ae8,0x1000,0x800,VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
               VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,image,subresourceRange);
    pQVar22 = sparseQueue;
    ppVVar14 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_808);
    (**(code **)(pQVar22->queueHandle + 0x368))
              (pQVar22,*ppVVar14,0x1000,0x1000,0,0,0,0,0,1,(int)local_ae8);
    makeBufferCreateInfo
              ((VkBufferCreateInfo *)
               &outputBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                m_allocator,(ulong)dVar6,2);
    pQVar22 = sparseQueue;
    pVVar9 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
    ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)
                       &outputBufferAlloc.
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
                        .field_0x8,(DeviceInterface *)pQVar22,pVVar9,
                       (VkBufferCreateInfo *)
                       &outputBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                        m_allocator,(VkAllocationCallbacks *)0x0);
    ::vk::refdetails::Move::operator_cast_to_RefData
              (&local_b80,
               (Move *)&outputBufferAlloc.
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
                        .field_0x8);
    uVar24 = (undefined4)local_b80.object.m_internal;
    uVar25 = (undefined4)(local_b80.object.m_internal >> 0x20);
    uVar26 = SUB84(local_b80.deleter.m_deviceIface,0);
    uVar27 = (undefined4)((ulong)local_b80.deleter.m_deviceIface >> 0x20);
    data_06.deleter.m_deviceIface._0_4_ = uVar26;
    data_06.object.m_internal = local_b80.object.m_internal;
    data_06.deleter.m_deviceIface._4_4_ = uVar27;
    data_06.deleter.m_device._0_4_ = (int)local_b80.deleter.m_device;
    data_06.deleter.m_device._4_4_ = (int)((ulong)local_b80.deleter.m_device >> 0x20);
    data_06.deleter.m_allocator._0_4_ = (int)local_b80.deleter.m_allocator;
    data_06.deleter.m_allocator._4_4_ = (int)((ulong)local_b80.deleter.m_allocator >> 0x20);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::Unique
              ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_b60,data_06);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move
              ((Move<vk::Handle<(vk::HandleType)8>_> *)
               &outputBufferAlloc.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                field_0x8);
    pQVar22 = sparseQueue;
    pVVar9 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
    pAVar15 = SparseResourcesBaseInstance::getAllocator(&this->super_SparseResourcesBaseInstance);
    pHVar16 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_b60);
    bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_bd0,
               (DeviceInterface *)pQVar22,pVVar9,pAVar15,(VkBuffer)pHVar16->m_internal,
               ::vk::MemoryRequirement::HostVisible);
    local_bc0 = de::details::MovePtr::operator_cast_to_PtrData(&local_bd0,(MovePtr *)pQVar22);
    data_00.ptr._4_4_ = uVar25;
    data_00.ptr._0_4_ = uVar24;
    data_00._8_4_ = uVar26;
    data_00._12_4_ = uVar27;
    de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::UniquePtr
              ((UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_bb0,data_00);
    de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
              ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_bd0);
    pQVar22 = sparseQueue;
    ppVVar14 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_808);
    pVVar1 = *ppVVar14;
    pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)9>_> *)local_238);
    dVar2 = pHVar10->m_internal;
    pHVar16 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_b60);
    outputBufferBarrier.size = pHVar16->m_internal;
    sVar21 = std::vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>::size
                       ((vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_> *)
                        &bufferOffset);
    pvVar13 = std::vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>::operator[]
                        ((vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_> *)
                         &bufferOffset,0);
    (**(code **)(pQVar22->queueHandle + 0x318))
              (pQVar22,pVVar1,dVar2,6,outputBufferBarrier.size,sVar21 & 0xffffffff,(int)pvVar13);
    pHVar16 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_b60);
    VStack_c30.m_internal = pHVar16->m_internal;
    makeBufferMemoryBarrier
              ((VkBufferMemoryBarrier *)local_c28,0x1000,0x2000,VStack_c30,0,(ulong)dVar6);
    pQVar22 = sparseQueue;
    ppVVar14 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_808);
    (**(code **)(pQVar22->queueHandle + 0x368))
              (pQVar22,*ppVVar14,0x1000,0x4000,0,0,0,1,(int)local_c28,0,0);
    pQVar22 = sparseQueue;
    ppVVar14 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_808);
    endCommandBuffer((DeviceInterface *)pQVar22,*ppVVar14);
    pQVar22 = sparseQueue;
    local_c34 = 0x1000;
    pVVar9 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
    pVVar3 = local_1c8->queueHandle;
    ppVVar14 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_808);
    commandBuffer_00 = *ppVVar14;
    pWaitSemaphores =
         ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)4>_>::get
                   ((RefBase<vk::Handle<(vk::HandleType)4>_> *)local_298);
    submitCommandsAndWait
              ((DeviceInterface *)pQVar22,pVVar9,pVVar3,commandBuffer_00,1,pWaitSemaphores,
               &local_c34,0,(VkSemaphore *)0x0);
    pQVar22 = sparseQueue;
    pVVar9 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
    pAVar18 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
              operator->((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                         local_bb0);
    outputData = (deUint8 *)::vk::Allocation::getMemory(pAVar18);
    pAVar18 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
              operator->((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                         local_bb0);
    VVar20 = ::vk::Allocation::getOffset(pAVar18);
    ::vk::invalidateMappedMemoryRange
              ((DeviceInterface *)pQVar22,pVVar9,(VkDeviceMemory)outputData,VVar20,(ulong)dVar6);
    pAVar18 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
              operator->((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                         local_bb0);
    _mipLevelSizeInBytes = ::vk::Allocation::getHostPtr(pAVar18);
    (**(code **)(sparseQueue->queueHandle + 0x18))(sparseQueue,computeQueue->queueHandle);
    for (bufferOffset_1 = 0; bufferOffset_1 < imageSparseInfo.extent.height;
        bufferOffset_1 = bufferOffset_1 + 1) {
      local_c50 = getImageMipLevelSizeInBytes
                            ((VkExtent3D *)&imageSparseInfo.imageType,imageSparseInfo.extent.depth,
                             &this->m_format,bufferOffset_1,1);
      pvVar13 = std::vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>::
                operator[]((vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_> *)
                           &bufferOffset,(ulong)bufferOffset_1);
      local_c54 = (uint)pvVar13->bufferOffset;
      pvVar19 = (void *)((long)_mipLevelSizeInBytes + (ulong)local_c54);
      pvVar17 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&valueNdx,
                           (ulong)local_c54);
      iVar7 = deMemCmp(pvVar19,pvVar17,(ulong)local_c50);
      if (iVar7 != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_c78,"Failed",&local_c79)
        ;
        tcu::TestStatus::fail(__return_storage_ptr__,&local_c78);
        std::__cxx11::string::~string((string *)&local_c78);
        std::allocator<char>::~allocator(&local_c79);
        goto LAB_00d684a6;
      }
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_ca0,"Passed",&local_ca1);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_ca0);
    std::__cxx11::string::~string((string *)&local_ca0);
    std::allocator<char>::~allocator(&local_ca1);
LAB_00d684a6:
    de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniquePtr
              ((UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_bb0);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::~Unique
              ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_b60);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&valueNdx);
    de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniquePtr
              ((UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_990);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::~Unique
              ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_940);
    std::vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>::~vector
              ((vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_> *)
               &bufferOffset);
    ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
              ((Unique<vk::VkCommandBuffer_s_*> *)local_808);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
              ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_7a8);
  }
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)4>_> *)local_298);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)9>_> *)local_238);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
  ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
             *)local_a0);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus ImageSparseBindingInstance::iterate (void)
{
	const InstanceInterface&	instance		= m_context.getInstanceInterface();
	const VkPhysicalDevice		physicalDevice	= m_context.getPhysicalDevice();
	VkImageCreateInfo			imageSparseInfo;
	std::vector<DeviceMemorySp>	deviceMemUniquePtrVec;

	// Check if image size does not exceed device limits
	if (!isImageSizeSupported(instance, physicalDevice, m_imageType, m_imageSize))
		TCU_THROW(NotSupportedError, "Image size not supported for device");

	// Check if device supports sparse binding
	if (!getPhysicalDeviceFeatures(instance, physicalDevice).sparseBinding)
		TCU_THROW(NotSupportedError, "Device does not support sparse binding");

	{
		// Create logical device supporting both sparse and compute queues
		QueueRequirementsVec queueRequirements;
		queueRequirements.push_back(QueueRequirements(VK_QUEUE_SPARSE_BINDING_BIT, 1u));
		queueRequirements.push_back(QueueRequirements(VK_QUEUE_COMPUTE_BIT, 1u));

		createDeviceSupportingQueues(queueRequirements);
	}

	const DeviceInterface&	deviceInterface	= getDeviceInterface();
	const Queue&			sparseQueue		= getQueue(VK_QUEUE_SPARSE_BINDING_BIT, 0);
	const Queue&			computeQueue	= getQueue(VK_QUEUE_COMPUTE_BIT, 0);

	imageSparseInfo.sType					= VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;					//VkStructureType		sType;
	imageSparseInfo.pNext					= DE_NULL;												//const void*			pNext;
	imageSparseInfo.flags					= VK_IMAGE_CREATE_SPARSE_BINDING_BIT;					//VkImageCreateFlags	flags;
	imageSparseInfo.imageType				= mapImageType(m_imageType);							//VkImageType			imageType;
	imageSparseInfo.format					= mapTextureFormat(m_format);							//VkFormat				format;
	imageSparseInfo.extent					= makeExtent3D(getLayerSize(m_imageType, m_imageSize));	//VkExtent3D			extent;
	imageSparseInfo.arrayLayers				= getNumLayers(m_imageType, m_imageSize);				//deUint32				arrayLayers;
	imageSparseInfo.samples					= VK_SAMPLE_COUNT_1_BIT;								//VkSampleCountFlagBits	samples;
	imageSparseInfo.tiling					= VK_IMAGE_TILING_OPTIMAL;								//VkImageTiling			tiling;
	imageSparseInfo.initialLayout			= VK_IMAGE_LAYOUT_UNDEFINED;							//VkImageLayout			initialLayout;
	imageSparseInfo.usage					= VK_IMAGE_USAGE_TRANSFER_SRC_BIT |
											  VK_IMAGE_USAGE_TRANSFER_DST_BIT;						//VkImageUsageFlags		usage;
	imageSparseInfo.sharingMode				= VK_SHARING_MODE_EXCLUSIVE;							//VkSharingMode			sharingMode;
	imageSparseInfo.queueFamilyIndexCount	= 0u;													//deUint32				queueFamilyIndexCount;
	imageSparseInfo.pQueueFamilyIndices		= DE_NULL;												//const deUint32*		pQueueFamilyIndices;

	if (m_imageType == IMAGE_TYPE_CUBE || m_imageType == IMAGE_TYPE_CUBE_ARRAY)
	{
		imageSparseInfo.flags |= VK_IMAGE_CREATE_CUBE_COMPATIBLE_BIT;
	}

	{
		VkImageFormatProperties imageFormatProperties;
		instance.getPhysicalDeviceImageFormatProperties(physicalDevice,
			imageSparseInfo.format,
			imageSparseInfo.imageType,
			imageSparseInfo.tiling,
			imageSparseInfo.usage,
			imageSparseInfo.flags,
			&imageFormatProperties);

		imageSparseInfo.mipLevels = getImageMaxMipLevels(imageFormatProperties, imageSparseInfo.extent);
	}

	// Create sparse image
	const Unique<VkImage> imageSparse(createImage(deviceInterface, getDevice(), &imageSparseInfo));

	// Create sparse image memory bind semaphore
	const Unique<VkSemaphore> imageMemoryBindSemaphore(createSemaphore(deviceInterface, getDevice()));

	// Get sparse image general memory requirements
	const VkMemoryRequirements imageSparseMemRequirements = getImageMemoryRequirements(deviceInterface, getDevice(), *imageSparse);

	// Check if required image memory size does not exceed device limits
	if (imageSparseMemRequirements.size > getPhysicalDeviceProperties(instance, physicalDevice).limits.sparseAddressSpaceSize)
		TCU_THROW(NotSupportedError, "Required memory size for sparse resource exceeds device limits");

	DE_ASSERT((imageSparseMemRequirements.size % imageSparseMemRequirements.alignment) == 0);

	{
		std::vector<VkSparseMemoryBind>	sparseMemoryBinds;
		const deUint32					numSparseBinds	= static_cast<deUint32>(imageSparseMemRequirements.size / imageSparseMemRequirements.alignment);
		const deUint32					memoryType		= findMatchingMemoryType(instance, physicalDevice, imageSparseMemRequirements, MemoryRequirement::Any);

		if (memoryType == NO_MATCH_FOUND)
			return tcu::TestStatus::fail("No matching memory type found");

		for (deUint32 sparseBindNdx = 0; sparseBindNdx < numSparseBinds; ++sparseBindNdx)
		{
			const VkSparseMemoryBind sparseMemoryBind = makeSparseMemoryBind(deviceInterface, getDevice(),
				imageSparseMemRequirements.alignment, memoryType, imageSparseMemRequirements.alignment * sparseBindNdx);

			deviceMemUniquePtrVec.push_back(makeVkSharedPtr(Move<VkDeviceMemory>(check<VkDeviceMemory>(sparseMemoryBind.memory), Deleter<VkDeviceMemory>(deviceInterface, getDevice(), DE_NULL))));

			sparseMemoryBinds.push_back(sparseMemoryBind);
		}

		const VkSparseImageOpaqueMemoryBindInfo opaqueBindInfo = makeSparseImageOpaqueMemoryBindInfo(*imageSparse, numSparseBinds, &sparseMemoryBinds[0]);

		const VkBindSparseInfo bindSparseInfo =
		{
			VK_STRUCTURE_TYPE_BIND_SPARSE_INFO,			//VkStructureType							sType;
			DE_NULL,									//const void*								pNext;
			0u,											//deUint32									waitSemaphoreCount;
			DE_NULL,									//const VkSemaphore*						pWaitSemaphores;
			0u,											//deUint32									bufferBindCount;
			DE_NULL,									//const VkSparseBufferMemoryBindInfo*		pBufferBinds;
			1u,											//deUint32									imageOpaqueBindCount;
			&opaqueBindInfo,							//const VkSparseImageOpaqueMemoryBindInfo*	pImageOpaqueBinds;
			0u,											//deUint32									imageBindCount;
			DE_NULL,									//const VkSparseImageMemoryBindInfo*		pImageBinds;
			1u,											//deUint32									signalSemaphoreCount;
			&imageMemoryBindSemaphore.get()				//const VkSemaphore*						pSignalSemaphores;
		};

		// Submit sparse bind commands for execution
		VK_CHECK(deviceInterface.queueBindSparse(sparseQueue.queueHandle, 1u, &bindSparseInfo, DE_NULL));
	}

	// Create command buffer for compute and transfer oparations
	const Unique<VkCommandPool>	  commandPool(makeCommandPool(deviceInterface, getDevice(), computeQueue.queueFamilyIndex));
	const Unique<VkCommandBuffer> commandBuffer(allocateCommandBuffer(deviceInterface, getDevice(), *commandPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	std::vector<VkBufferImageCopy> bufferImageCopy(imageSparseInfo.mipLevels);

	{
		deUint32 bufferOffset = 0;
		for (deUint32 mipmapNdx = 0; mipmapNdx < imageSparseInfo.mipLevels; mipmapNdx++)
		{
			bufferImageCopy[mipmapNdx] = makeBufferImageCopy(mipLevelExtents(imageSparseInfo.extent, mipmapNdx), imageSparseInfo.arrayLayers, mipmapNdx, static_cast<VkDeviceSize>(bufferOffset));
			bufferOffset += getImageMipLevelSizeInBytes(imageSparseInfo.extent, imageSparseInfo.arrayLayers, m_format, mipmapNdx, BUFFER_IMAGE_COPY_OFFSET_GRANULARITY);
		}
	}

	// Start recording commands
	beginCommandBuffer(deviceInterface, *commandBuffer);

	const deUint32					imageSizeInBytes		= getImageSizeInBytes(imageSparseInfo.extent, imageSparseInfo.arrayLayers, m_format, imageSparseInfo.mipLevels, BUFFER_IMAGE_COPY_OFFSET_GRANULARITY);
	const VkBufferCreateInfo		inputBufferCreateInfo	= makeBufferCreateInfo(imageSizeInBytes, VK_BUFFER_USAGE_TRANSFER_SRC_BIT);
	const Unique<VkBuffer>			inputBuffer				(createBuffer(deviceInterface, getDevice(), &inputBufferCreateInfo));
	const de::UniquePtr<Allocation>	inputBufferAlloc		(bindBuffer(deviceInterface, getDevice(), getAllocator(), *inputBuffer, MemoryRequirement::HostVisible));

	std::vector<deUint8> referenceData(imageSizeInBytes);

	for (deUint32 valueNdx = 0; valueNdx < imageSizeInBytes; ++valueNdx)
	{
		referenceData[valueNdx] = static_cast<deUint8>((valueNdx % imageSparseMemRequirements.alignment) + 1u);
	}

	deMemcpy(inputBufferAlloc->getHostPtr(), &referenceData[0], imageSizeInBytes);

	flushMappedMemoryRange(deviceInterface, getDevice(), inputBufferAlloc->getMemory(), inputBufferAlloc->getOffset(), imageSizeInBytes);

	{
		const VkBufferMemoryBarrier inputBufferBarrier = makeBufferMemoryBarrier
		(
			VK_ACCESS_HOST_WRITE_BIT,
			VK_ACCESS_TRANSFER_READ_BIT,
			*inputBuffer,
			0u,
			imageSizeInBytes
		);

		deviceInterface.cmdPipelineBarrier(*commandBuffer, VK_PIPELINE_STAGE_HOST_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u, 0u, DE_NULL, 1u, &inputBufferBarrier, 0u, DE_NULL);
	}

	{
		const VkImageMemoryBarrier imageSparseTransferDstBarrier = makeImageMemoryBarrier
		(
			0u,
			VK_ACCESS_TRANSFER_WRITE_BIT,
			VK_IMAGE_LAYOUT_UNDEFINED,
			VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
			sparseQueue.queueFamilyIndex != computeQueue.queueFamilyIndex ? sparseQueue.queueFamilyIndex : VK_QUEUE_FAMILY_IGNORED,
			sparseQueue.queueFamilyIndex != computeQueue.queueFamilyIndex ? computeQueue.queueFamilyIndex : VK_QUEUE_FAMILY_IGNORED,
			*imageSparse,
			makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, imageSparseInfo.mipLevels, 0u, imageSparseInfo.arrayLayers)
		);

		deviceInterface.cmdPipelineBarrier(*commandBuffer, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u, 0u, DE_NULL, 0u, DE_NULL, 1u, &imageSparseTransferDstBarrier);
	}

	deviceInterface.cmdCopyBufferToImage(*commandBuffer, *inputBuffer, *imageSparse, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, static_cast<deUint32>(bufferImageCopy.size()), &bufferImageCopy[0]);

	{
		const VkImageMemoryBarrier imageSparseTransferSrcBarrier = makeImageMemoryBarrier
		(
			VK_ACCESS_TRANSFER_WRITE_BIT,
			VK_ACCESS_TRANSFER_READ_BIT,
			VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
			VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
			*imageSparse,
			makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, imageSparseInfo.mipLevels, 0u, imageSparseInfo.arrayLayers)
		);

		deviceInterface.cmdPipelineBarrier(*commandBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u, 0u, DE_NULL, 0u, DE_NULL, 1u, &imageSparseTransferSrcBarrier);
	}

	const VkBufferCreateInfo		outputBufferCreateInfo	= makeBufferCreateInfo(imageSizeInBytes, VK_BUFFER_USAGE_TRANSFER_DST_BIT);
	const Unique<VkBuffer>			outputBuffer			(createBuffer(deviceInterface, getDevice(), &outputBufferCreateInfo));
	const de::UniquePtr<Allocation>	outputBufferAlloc		(bindBuffer(deviceInterface, getDevice(), getAllocator(), *outputBuffer, MemoryRequirement::HostVisible));

	deviceInterface.cmdCopyImageToBuffer(*commandBuffer, *imageSparse, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *outputBuffer, static_cast<deUint32>(bufferImageCopy.size()), &bufferImageCopy[0]);

	{
		const VkBufferMemoryBarrier outputBufferBarrier = makeBufferMemoryBarrier
		(
			VK_ACCESS_TRANSFER_WRITE_BIT,
			VK_ACCESS_HOST_READ_BIT,
			*outputBuffer,
			0u,
			imageSizeInBytes
		);

		deviceInterface.cmdPipelineBarrier(*commandBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u, 0u, DE_NULL, 1u, &outputBufferBarrier, 0u, DE_NULL);
	}

	// End recording commands
	endCommandBuffer(deviceInterface, *commandBuffer);

	const VkPipelineStageFlags stageBits[] = { VK_PIPELINE_STAGE_TRANSFER_BIT };

	// Submit commands for execution and wait for completion
	submitCommandsAndWait(deviceInterface, getDevice(), computeQueue.queueHandle, *commandBuffer, 1u, &imageMemoryBindSemaphore.get(), stageBits);

	// Retrieve data from buffer to host memory
	invalidateMappedMemoryRange(deviceInterface, getDevice(), outputBufferAlloc->getMemory(), outputBufferAlloc->getOffset(), imageSizeInBytes);

	const deUint8* outputData = static_cast<const deUint8*>(outputBufferAlloc->getHostPtr());

	// Wait for sparse queue to become idle
	deviceInterface.queueWaitIdle(sparseQueue.queueHandle);

	for (deUint32 mipmapNdx = 0; mipmapNdx < imageSparseInfo.mipLevels; ++mipmapNdx)
	{
		const deUint32 mipLevelSizeInBytes	= getImageMipLevelSizeInBytes(imageSparseInfo.extent, imageSparseInfo.arrayLayers, m_format, mipmapNdx);
		const deUint32 bufferOffset			= static_cast<deUint32>(bufferImageCopy[mipmapNdx].bufferOffset);

		if (deMemCmp(outputData + bufferOffset, &referenceData[bufferOffset], mipLevelSizeInBytes) != 0)
			return tcu::TestStatus::fail("Failed");
	}

	return tcu::TestStatus::pass("Passed");
}